

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_map_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
                    uint32_t size,AMQP_MAP_KEY_VALUE_PAIR *pairs,_Bool use_smallest)

{
  int iVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000089;
  char *pcVar6;
  AMQP_VALUE *ppAVar7;
  uchar local_3a;
  uchar local_39;
  uchar local_38;
  uchar local_37;
  uchar local_36;
  uchar local_35;
  uchar local_34;
  uchar local_33;
  uchar local_32;
  uchar local_31;
  
  iVar2 = count * 2;
  if ((int)CONCAT71(in_register_00000089,use_smallest) == 0) {
    iVar4 = size + 4;
    local_36 = (uchar)((uint)iVar4 >> 0x18);
    iVar1 = (*encoder_output)(context,&local_36,1);
    if (iVar1 == 0) {
      local_35 = (uchar)((uint)iVar4 >> 0x10);
      iVar1 = (*encoder_output)(context,&local_35,1);
      if (iVar1 == 0) {
        local_3a = (uchar)((uint)iVar4 >> 8);
        iVar1 = (*encoder_output)(context,&local_3a,1);
        if (iVar1 == 0) {
          local_34 = (uchar)iVar4;
          iVar1 = (*encoder_output)(context,&local_34,1);
          if (iVar1 == 0) {
            local_33 = (uchar)((uint)iVar2 >> 0x18);
            iVar1 = (*encoder_output)(context,&local_33,1);
            if (iVar1 == 0) {
              local_32 = (uchar)((uint)iVar2 >> 0x10);
              iVar1 = (*encoder_output)(context,&local_32,1);
              if (iVar1 == 0) {
                local_39 = (uchar)((uint)iVar2 >> 8);
                iVar1 = (*encoder_output)(context,&local_39,1);
                if ((iVar1 == 0) &&
                   (local_31 = (uchar)iVar2, iVar2 = (*encoder_output)(context,&local_31,1),
                   iVar2 == 0)) goto LAB_0010cc86;
              }
            }
          }
        }
      }
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0xfe2;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xfe2;
    }
    pcVar6 = "Could not encode large map header";
    iVar1 = 0xfe1;
  }
  else {
    local_38 = (char)size + '\x01';
    iVar1 = (*encoder_output)(context,&local_38,1);
    if ((iVar1 != 0) ||
       (local_37 = (uchar)iVar2, iVar2 = (*encoder_output)(context,&local_37,1), iVar2 != 0)) {
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0xfca;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0xfca;
      }
      pcVar6 = "Could not encode small map header";
      iVar1 = 0xfc9;
      goto LAB_0010cc6a;
    }
LAB_0010cc86:
    if (count == 0) {
      return 0;
    }
    ppAVar7 = &pairs->value;
    uVar5 = 0;
    while ((iVar2 = amqpvalue_encode(((AMQP_MAP_KEY_VALUE_PAIR *)(ppAVar7 + -1))->key,encoder_output
                                     ,context), iVar2 == 0 &&
           (iVar2 = amqpvalue_encode(*ppAVar7,encoder_output,context), iVar2 == 0))) {
      uVar5 = uVar5 + 1;
      ppAVar7 = ppAVar7 + 2;
      if (count == uVar5) {
        return 0;
      }
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"encode_map_value",0xff3,1,"Failed encoding map element %u",(int)uVar5);
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0xffb;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xffb;
    }
    pcVar6 = "Could not encode map";
    iVar1 = 0xffa;
  }
LAB_0010cc6a:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"encode_map_value",iVar1,1,pcVar6);
  return iVar2;
}

Assistant:

static int encode_map_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, uint32_t size, AMQP_MAP_KEY_VALUE_PAIR* pairs, bool use_smallest)
{
    int result;
    size_t i;

    /* Codes_SRS_AMQPVALUE_01_124: [Map encodings MUST contain an even number of items (i.e. an equal number of keys and values).] */
    uint32_t elements = count * 2;

    if (use_smallest)
    {
        size++;

        /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xc1" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size & 0xFF)) != 0) ||
            (output_byte(encoder_output, context, (elements & 0xFF)) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode small map header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        size += 4;

        /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xd1" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, size & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (elements >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, elements & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode large map header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    if (result == 0)
    {
        /* Codes_SRS_AMQPVALUE_01_123: [A map is encoded as a compound value where the constituent elements form alternating key value pairs.] */
        for (i = 0; i < count; i++)
        {
            if ((amqpvalue_encode(pairs[i].key, encoder_output, context) != 0) ||
                (amqpvalue_encode(pairs[i].value, encoder_output, context) != 0))
            {
                LogError("Failed encoding map element %u", (unsigned int)i);
                break;
            }
        }

        if (i < count)
        {
            LogError("Could not encode map");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}